

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool __thiscall
crnlib::image_utils::error_metrics::compute
          (error_metrics *this,image_u8 *a,image_u8 *b,uint first_channel,uint num_channels,
          bool average_component_error)

{
  color_quad<unsigned_char,_int> *pcVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint uVar5;
  byte bVar6;
  uint i;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double hist [256];
  double local_838 [257];
  
  uVar12 = b->m_width;
  if (a->m_width < b->m_width) {
    uVar12 = a->m_width;
  }
  uVar5 = b->m_height;
  if (a->m_height < b->m_height) {
    uVar5 = a->m_height;
  }
  uVar10 = 0;
  memset(local_838,0,0x800);
  if (uVar5 != 0) {
    pcVar3 = a->m_pPixels;
    uVar8 = a->m_pitch;
    pcVar4 = b->m_pPixels;
    uVar11 = b->m_pitch;
    do {
      if (uVar12 != 0) {
        uVar17 = 0;
        do {
          pcVar1 = pcVar3 + (uVar8 * uVar10 + (int)uVar17);
          pcVar2 = pcVar4 + (uVar11 * uVar10 + (int)uVar17);
          uVar15 = (ulong)num_channels;
          uVar18 = first_channel;
          if (num_channels == 0) {
            uVar14 = ((uint)(pcVar1->field_0).field_0.b * 0x1d2f + 0x8000 +
                      (uint)(pcVar1->field_0).field_0.g * 0x9646 +
                      (uint)(pcVar1->field_0).field_0.r * 0x4c8b >> 0x10) -
                     ((uint)(pcVar2->field_0).field_0.b * 0x1d2f + 0x8000 +
                      (uint)(pcVar2->field_0).field_0.g * 0x9646 +
                      (uint)(pcVar2->field_0).field_0.r * 0x4c8b >> 0x10);
            uVar7 = -uVar14;
            if (0 < (int)uVar14) {
              uVar7 = uVar14;
            }
            local_838[uVar7] = local_838[uVar7] + 1.0;
          }
          else {
            do {
              iVar16 = (uint)(pcVar1->field_0).c[uVar18] - (uint)(pcVar2->field_0).c[uVar18];
              bVar6 = (byte)iVar16;
              bVar13 = -bVar6;
              if (0 < iVar16) {
                bVar13 = bVar6;
              }
              local_838[bVar13] = local_838[bVar13] + 1.0;
              uVar18 = uVar18 + 1;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar12);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  this->mMax = 0;
  lVar9 = 0;
  dVar19 = 0.0;
  dVar20 = 0.0;
  uVar10 = 0;
  do {
    dVar21 = local_838[lVar9];
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      uVar7 = (uint)lVar9;
      if (uVar10 <= uVar7) {
        uVar10 = uVar7;
      }
      this->mMax = uVar10;
      dVar21 = dVar21 * (double)(int)uVar7;
      dVar20 = dVar20 + dVar21;
      dVar19 = dVar19 + dVar21 * (double)(int)uVar7;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x100);
  dVar21 = (double)(uVar5 * uVar12);
  if (average_component_error) {
    uVar8 = 4;
    if (num_channels < 4) {
      uVar8 = num_channels;
    }
    uVar11 = 1;
    if (num_channels != 0) {
      uVar11 = uVar8;
    }
    dVar21 = dVar21 * (double)(int)uVar11;
  }
  dVar20 = dVar20 / dVar21;
  dVar22 = 255.0;
  if (dVar20 <= 255.0) {
    dVar22 = dVar20;
  }
  this->mMean = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar22);
  dVar19 = dVar19 / dVar21;
  dVar20 = 65025.0;
  if (dVar19 <= 65025.0) {
    dVar20 = dVar19;
  }
  dVar20 = (double)(~-(ulong)(dVar19 < 0.0) & (ulong)dVar20);
  this->mMeanSquared = dVar20;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  this->mRootMeanSquared = dVar20;
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    dVar20 = log10(255.0 / dVar20);
    dVar20 = dVar20 * 20.0;
    dVar19 = 500.0;
    if (dVar20 <= 500.0) {
      dVar19 = dVar20;
    }
    dVar19 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar19);
  }
  else {
    dVar19 = 999999.0;
  }
  this->mPeakSNR = dVar19;
  return true;
}

Assistant:

bool error_metrics::compute(const image_u8& a, const image_u8& b, uint first_channel, uint num_channels, bool average_component_error)
        {
            //if ( (!a.get_width()) || (!b.get_height()) || (a.get_width() != b.get_width()) || (a.get_height() != b.get_height()) )
            //   return false;

            const uint width = math::minimum(a.get_width(), b.get_width());
            const uint height = math::minimum(a.get_height(), b.get_height());

            CRNLIB_ASSERT((first_channel < 4U) && (first_channel + num_channels <= 4U));

            // Histogram approach due to Charles Bloom.
            double hist[256];
            utils::zero_object(hist);

            for (uint y = 0; y < height; y++)
            {
                for (uint x = 0; x < width; x++)
                {
                    const color_quad_u8& ca = a(x, y);
                    const color_quad_u8& cb = b(x, y);

                    if (!num_channels)
                    {
                        hist[labs(ca.get_luma() - cb.get_luma())]++;
                    }
                    else
                    {
                        for (uint c = 0; c < num_channels; c++)
                        {
                            hist[labs(ca[first_channel + c] - cb[first_channel + c])]++;
                        }
                    }
                }
            }

            mMax = 0;
            double sum = 0.0f, sum2 = 0.0f;
            for (uint i = 0; i < 256; i++)
            {
                if (!hist[i])
                {
                    continue;
                }

                mMax = math::maximum(mMax, i);

                double x = i * hist[i];

                sum += x;
                sum2 += i * x;
            }

            // See http://bmrc.berkeley.edu/courseware/cs294/fall97/assignment/psnr.html
            double total_values = width * height;

            if (average_component_error)
            {
                total_values *= math::clamp<uint>(num_channels, 1, 4);
            }

            mMean = math::clamp<double>(sum / total_values, 0.0f, 255.0f);
            mMeanSquared = math::clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

            mRootMeanSquared = sqrt(mMeanSquared);

            if (!mRootMeanSquared)
            {
                mPeakSNR = cInfinitePSNR;
            }
            else
            {
                mPeakSNR = math::clamp<double>(log10(255.0f / mRootMeanSquared) * 20.0f, 0.0f, 500.0f);
            }

            return true;
        }